

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skew.cpp
# Opt level: O2

AggregateFunction * duckdb::SkewnessFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  FunctionNullHandling in_R8B;
  LogicalType local_40;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,DOUBLE);
  LogicalType::LogicalType(&local_40,DOUBLE);
  AggregateFunction::
  UnaryAggregate<duckdb::SkewState,double,double,duckdb::SkewnessOperation,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffd8,&local_40,(LogicalType *)0x0,
             in_R8B);
  LogicalType::~LogicalType(&local_40);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  return in_RDI;
}

Assistant:

AggregateFunction SkewnessFun::GetFunction() {
	return AggregateFunction::UnaryAggregate<SkewState, double, double, SkewnessOperation>(LogicalType::DOUBLE,
	                                                                                       LogicalType::DOUBLE);
}